

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckSemicolonSpace.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckSemicolonSpace(Parser *this,unsigned_long max)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  char *__s;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  string *psVar9;
  ulong uVar10;
  Error error;
  value_type local_d8;
  unsigned_long local_a0;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  this->m_TestsDone[7] = true;
  __s = (char *)operator_new__(0xff);
  bVar4 = 0;
  local_a0 = max;
  snprintf(__s,0xff,"Semicolons = %ld max spaces",max);
  pcVar6 = (char *)this->m_TestsDescription[7]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 7),0,pcVar6,(ulong)__s);
  operator_delete__(__s);
  psVar9 = &this->m_BufferNoComment;
  sVar5 = std::__cxx11::string::find((char *)psVar9,0x177d56,0);
  if (sVar5 != 0xffffffffffffffff) {
    bVar4 = 0;
    do {
      if (0 < (long)sVar5) {
        uVar10 = 0;
        sVar7 = sVar5;
        do {
          sVar8 = sVar7 - 1;
          cVar1 = (psVar9->_M_dataplus)._M_p[sVar8];
          if (cVar1 != ' ') {
            if ((cVar1 != '\n') && (local_a0 < uVar10)) {
              local_d8.description._M_dataplus._M_p = (pointer)&local_d8.description.field_2;
              local_d8.description._M_string_length = 0;
              local_d8.description.field_2._M_local_buf[0] = '\0';
              local_d8.line = GetLineNumber(this,sVar5,true);
              local_d8.number = 7;
              local_d8.line2 = local_d8.line;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_d8.description,0,
                         (char *)local_d8.description._M_string_length,0x17823e);
              pcVar6 = (char *)operator_new__(10);
              snprintf(pcVar6,10,"%ld",uVar10);
              std::__cxx11::string::append((char *)&local_d8.description);
              std::__cxx11::string::append((char *)&local_d8.description);
              operator_delete__(pcVar6);
              pcVar6 = (char *)operator_new__(10);
              snprintf(pcVar6,10,"%ld",local_a0);
              std::__cxx11::string::append((char *)&local_d8.description);
              std::__cxx11::string::append((char *)&local_d8.description);
              operator_delete__(pcVar6);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,&local_d8);
              if (this->m_FixFile == true) {
                sVar7 = GetPositionWithComments(this,sVar5 - uVar10);
                ReplaceCharInFixedBuffer(this,sVar7,uVar10,"");
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8.description._M_dataplus._M_p != &local_d8.description.field_2) {
                operator_delete(local_d8.description._M_dataplus._M_p);
              }
              bVar4 = 1;
            }
            break;
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
          bVar3 = IsBetweenQuote(this,sVar8,false,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          uVar10 = uVar10 + !bVar3;
          bVar3 = 1 < (long)sVar7;
          sVar7 = sVar8;
        } while (bVar3);
      }
      sVar5 = std::__cxx11::string::find((char *)psVar9,0x177d56,sVar5 + 1);
    } while (sVar5 != 0xffffffffffffffff);
  }
  sVar5 = std::__cxx11::string::find((char *)psVar9,0x177d56,0);
  if (sVar5 != 0xffffffffffffffff) {
    local_98 = psVar9;
    do {
      if (sVar5 + 1 < (this->m_BufferNoComment)._M_string_length) {
        do {
          sVar7 = sVar5 + 1;
          bVar2 = (psVar9->_M_dataplus)._M_p[sVar5 + 1];
          if (bVar2 < 0x20) {
            if ((bVar2 != 10) && (bVar2 != 0xd)) break;
          }
          else if (bVar2 != 0x20) {
            if (bVar2 != 0x3b) break;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
            bVar3 = IsBetweenCharsFast(this,'(',')',sVar7,false,&local_70);
            if (bVar3) {
              bVar3 = false;
            }
            else {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
              bVar3 = IsBetweenQuote(this,sVar7,false,&local_90);
              bVar3 = !bVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            psVar9 = local_98;
            if (bVar3) {
              local_d8.description._M_dataplus._M_p = (pointer)&local_d8.description.field_2;
              local_d8.description._M_string_length = 0;
              local_d8.description.field_2._M_local_buf[0] = '\0';
              local_d8.line = GetLineNumber(this,sVar7,true);
              local_d8.number = 7;
              local_d8.line2 = local_d8.line;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_d8.description,0,
                         (char *)local_d8.description._M_string_length,0x178269);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,&local_d8);
              if (this->m_FixFile == true) {
                sVar8 = GetPositionWithComments(this,sVar7);
                ReplaceCharInFixedBuffer(this,sVar8,1,"");
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8.description._M_dataplus._M_p != &local_d8.description.field_2) {
                operator_delete(local_d8.description._M_dataplus._M_p);
              }
              bVar4 = 1;
            }
          }
          uVar10 = sVar5 + 2;
          sVar5 = sVar7;
        } while (uVar10 < (this->m_BufferNoComment)._M_string_length);
      }
      sVar5 = std::__cxx11::string::find((char *)psVar9,0x177d56,sVar5 + 2);
    } while (sVar5 != 0xffffffffffffffff);
  }
  return (bool)(~bVar4 & 1);
}

Assistant:

bool Parser::CheckSemicolonSpace(unsigned long max)
{
  m_TestsDone[SEMICOLON_SPACE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Semicolons = %ld max spaces",max);
  m_TestsDescription[SEMICOLON_SPACE] = val;
  delete [] val;

  bool hasError = false;
  auto posSemicolon = static_cast<long int>(m_BufferNoComment.find(";", 0));
  while(posSemicolon != -1)
    {
    // We try to find the word before that
    long i=posSemicolon-1;
    unsigned long space = 0;
    while(i>=0)
      {
       if(m_BufferNoComment[i] == ' ')
        {
        if(!IsBetweenQuote(i))
          {
          space++;
          }
        }
       else
        {
        if(m_BufferNoComment[i] != '\n' && space > max)
          {
          Error error;
          error.line = this->GetLineNumber(posSemicolon,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Number of spaces before semicolon exceed: ";
          constexpr size_t length = 10;
          char* localval = new char[length];
          snprintf(localval,length,"%ld",space);
          error.description += localval;
          error.description += " (max=";
          delete [] localval;
          localval = new char[length];
          snprintf(localval,length,"%ld",max);
          error.description += localval;
          error.description += ")";
          delete [] localval;
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(posSemicolon-space),space,"");
            }
          } // space > max
        break;
        }
      i--;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",posSemicolon+1));
    }

  // We also check if we have two or more semicolons following each other
  posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",0));
  while(posSemicolon != -1)
    {
    // We look forward
    unsigned long i=posSemicolon+1;
    while(i<m_BufferNoComment.size())
      {
      if(m_BufferNoComment[i] == ' ' || m_BufferNoComment[i] == '\r' || m_BufferNoComment[i] == '\n')
        {
        // this is normal
        }
      else if(m_BufferNoComment[i] == ';')
        {
        // if we have for ( ;; ) we don't report
        // or ";;"
        if(!this->IsBetweenCharsFast('(',')',i)
           && !this->IsBetweenQuote(i))
          {
          Error error;
          error.line = this->GetLineNumber(i,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Too many semicolons";
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(i),1,"");
            }
          }
        }
      else
        {
        break;
        }
      i++;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",i+1));
    }

  return !hasError;
}